

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2publicvectors.c
# Opt level: O2

void test_v2publicvectors(void)

{
  char *__s;
  uint __line;
  uint8_t *puVar1;
  char cVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  undefined8 *puVar5;
  size_t sVar6;
  size_t sVar7;
  void *__s2;
  undefined8 *puVar8;
  undefined8 *puVar9;
  size_t footer_len;
  undefined8 *local_4a8;
  uint8_t *footer;
  uint8_t public_key [32];
  uint8_t secret_key [64];
  size_t dec_len;
  
  cVar2 = paseto_v2_public_load_secret_key_hex
                    (secret_key,
                     "b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a37741eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
                    );
  if (cVar2 == '\0') {
    pcVar4 = 
    "paseto_v2_public_load_secret_key_hex(secret_key, \"b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a3774\" \"1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2\" ) == true"
    ;
    __line = 0x45;
  }
  else {
    cVar2 = paseto_v2_public_load_public_key_hex
                      (public_key,"1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
                      );
    if (cVar2 == '\0') {
      pcVar4 = 
      "paseto_v2_public_load_public_key_hex(public_key, \"1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2\" ) == true"
      ;
      __line = 0x48;
    }
    else {
      __stream = fopen("test/v2publicvectors.csv","r");
      if (__stream == (FILE *)0x0) {
        perror("Failed to load v2publicvectors.csv");
        abort();
      }
      puVar8 = (undefined8 *)0x0;
      puVar9 = (undefined8 *)0x0;
      while (pcVar4 = fgets((char *)&dec_len,0x400,__stream), pcVar4 != (char *)0x0) {
        if ((char)dec_len != '#') {
          puVar5 = (undefined8 *)calloc(1,0x30);
          pcVar4 = strdup((char *)&dec_len);
          puVar5[1] = pcVar4;
          pcVar4 = strchr(pcVar4,0x3b);
          *pcVar4 = '\0';
          puVar5[2] = pcVar4 + 1;
          local_4a8 = puVar9;
          pcVar4 = strchr(pcVar4 + 1,0x3b);
          *pcVar4 = '\0';
          puVar5[3] = pcVar4 + 1;
          pcVar4 = strchr(pcVar4 + 1,0x3b);
          *pcVar4 = '\0';
          puVar5[4] = pcVar4 + 1;
          pcVar4 = strchr(pcVar4 + 1,0x3b);
          *pcVar4 = '\0';
          puVar5[5] = pcVar4 + 1;
          pcVar4 = strchr(pcVar4 + 1,10);
          *pcVar4 = '\0';
          if (puVar8 == (undefined8 *)0x0) {
            puVar8 = puVar5;
          }
          puVar9 = puVar5;
          if (local_4a8 != (undefined8 *)0x0) {
            *local_4a8 = puVar5;
          }
        }
      }
      while( true ) {
        if (puVar8 == (undefined8 *)0x0) {
          return;
        }
        printf("Running test \'%s\'...",puVar8[1]);
        pcVar4 = (char *)puVar8[3];
        sVar6 = strlen(pcVar4);
        __s = (char *)puVar8[4];
        sVar7 = strlen(__s);
        pcVar4 = (char *)paseto_v2_public_sign(pcVar4,sVar6,secret_key,__s,sVar7);
        if (pcVar4 == (char *)0x0) break;
        iVar3 = strcmp((char *)puVar8[5],pcVar4);
        if (iVar3 != 0) {
          pcVar4 = "strcmp(case_->signed_message, enc) == 0";
          __line = 0x53;
          goto LAB_0010232c;
        }
        free(pcVar4);
        printf(" signing ok...");
        __s2 = (void *)paseto_v2_public_verify(puVar8[5],&dec_len,public_key,&footer,&footer_len);
        if (__s2 == (void *)0x0) {
          perror("paseto_v2_public_verify failed");
          pcVar4 = "dec != NULL";
          __line = 0x5f;
          goto LAB_0010232c;
        }
        sVar6 = CONCAT71(dec_len._1_7_,(char)dec_len);
        pcVar4 = (char *)puVar8[3];
        sVar7 = strlen(pcVar4);
        if (sVar6 != sVar7) {
          pcVar4 = "dec_len == strlen(case_->message)";
          __line = 0x60;
          goto LAB_0010232c;
        }
        iVar3 = bcmp(pcVar4,__s2,sVar6);
        if (iVar3 != 0) {
          pcVar4 = "memcmp(case_->message, dec, dec_len) == 0";
          __line = 0x61;
          goto LAB_0010232c;
        }
        paseto_free(__s2);
        pcVar4 = (char *)puVar8[4];
        sVar6 = strlen(pcVar4);
        puVar1 = footer;
        if (sVar6 == 0) {
          if (footer != (uint8_t *)0x0) {
            pcVar4 = "footer == NULL";
            __line = 100;
            goto LAB_0010232c;
          }
          if (footer_len != 0) {
            pcVar4 = "footer_len == 0";
            __line = 0x65;
            goto LAB_0010232c;
          }
        }
        else {
          if (footer == (uint8_t *)0x0) {
            pcVar4 = "footer != NULL";
            __line = 0x67;
            goto LAB_0010232c;
          }
          if (footer_len != sVar6) {
            pcVar4 = "footer_len == strlen(case_->footer)";
            __line = 0x68;
            goto LAB_0010232c;
          }
          iVar3 = strcmp(pcVar4,(char *)footer);
          if (iVar3 != 0) {
            pcVar4 = "strcmp(case_->footer, (const char *) footer) == 0";
            __line = 0x69;
            goto LAB_0010232c;
          }
          paseto_free(puVar1);
        }
        puts(" verifying ok");
        puVar8 = (undefined8 *)*puVar8;
      }
      perror("paseto_v2_public_sign failed");
      pcVar4 = "enc != NULL";
      __line = 0x52;
    }
  }
LAB_0010232c:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2publicvectors.c"
                ,__line,"void test_v2publicvectors(void)");
}

Assistant:

void test_v2publicvectors(void) {
    uint8_t public_key[paseto_v2_PUBLIC_PUBLICKEYBYTES];
    uint8_t secret_key[paseto_v2_PUBLIC_SECRETKEYBYTES];
    assert(paseto_v2_public_load_secret_key_hex(secret_key,
            "b4cbfb43df4ce210727d953e4a713307fa19bb7d9f85041438d9e11b942a3774"
            "1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
            ) == true);
    assert(paseto_v2_public_load_public_key_hex(public_key,
            "1eb9dbbbbc047c03fd70604e0071f0987e16b28b757225c11f00415d0e20b1a2"
            ) == true);

    struct test_case *cases = load_csv();
    for (struct test_case *case_ = cases; case_; case_ = case_->next) {
        printf("Running test '%s'...", case_->name);
        char *enc = paseto_v2_public_sign(
                (const uint8_t *) case_->message, strlen(case_->message),
                secret_key,
                (const uint8_t *) case_->footer, strlen(case_->footer));
        if (!enc) perror("paseto_v2_public_sign failed");
        assert(enc != NULL);
        assert(strcmp(case_->signed_message, enc) == 0);
        free(enc);
        printf(" signing ok...");

        size_t dec_len;
        uint8_t *footer;
        size_t footer_len;
        uint8_t *dec = paseto_v2_public_verify(
                case_->signed_message, &dec_len,
                public_key,
                &footer, &footer_len);
        if (!dec) perror("paseto_v2_public_verify failed");
        assert(dec != NULL);
        assert(dec_len == strlen(case_->message));
        assert(memcmp(case_->message, dec, dec_len) == 0);
        paseto_free(dec);
        if (strlen(case_->footer) == 0) {
            assert(footer == NULL);
            assert(footer_len == 0);
        } else {
            assert(footer != NULL);
            assert(footer_len == strlen(case_->footer));
            assert(strcmp(case_->footer, (const char *) footer) == 0);
            paseto_free(footer);
        }
        printf(" verifying ok\n");
    }
}